

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

string * __thiscall
cfd::js::api::json::DecodePsbtInput::GetSighashString_abi_cxx11_
          (string *__return_storage_ptr__,DecodePsbtInput *this,DecodePsbtInput *obj)

{
  core::ConvertToString<std::__cxx11::string>
            (__return_storage_ptr__,(core *)&this->sighash_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)obj);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetSighashString(  // line separate
      const DecodePsbtInput& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.sighash_);
  }